

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priminfo_mb.h
# Opt level: O2

SetMB * __thiscall
embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>
          (SetMB *__return_storage_ptr__,SetMB *this,VirtualRecalculatePrimRef *recalculatePrimRef,
          LinearSpace3fa *space)

{
  BBox1f BVar1;
  BBox1f BVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  PrimRefVector pmVar5;
  char cVar6;
  runtime_error *this_00;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  task_group_context *in_stack_fffffffffffffdc8;
  anon_class_24_3_3f686411 computePrimInfo;
  float local_208;
  float fStack_204;
  blocked_range<unsigned_long> local_1f8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  undefined8 local_174;
  undefined4 local_16c;
  code *local_160 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_150;
  undefined1 local_140 [8];
  task_group_context context;
  PrimInfoMB pinfo;
  
  uVar3 = (this->super_PrimInfoMB).object_range._begin;
  uVar4 = (this->super_PrimInfoMB).object_range._end;
  local_1f8.my_end = 0x7f8000007f800000;
  local_1f8.my_begin = 0x7f8000007f800000;
  local_1f8.my_grainsize = 0xff800000ff800000;
  uStack_1e0 = 0xff800000ff800000;
  local_1d8 = 0x7f8000007f800000;
  uStack_1d0 = 0x7f8000007f800000;
  local_1c8 = 0xff800000ff800000;
  uStack_1c0 = 0xff800000ff800000;
  local_1b8 = 0x7f8000007f800000;
  uStack_1b0 = 0x7f8000007f800000;
  local_1a8 = 0xff800000ff800000;
  uStack_1a0 = 0xff800000ff800000;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  local_174 = 0x3f8000003f800000;
  local_16c = 0;
  computePrimInfo.this = this;
  computePrimInfo.recalculatePrimRef = recalculatePrimRef;
  computePrimInfo.space = space;
  if (uVar4 - uVar3 < 0xc00) {
    context.my_cpu_ctl_env = uVar3;
    context._8_8_ = uVar4;
    primInfo<embree::sse2::VirtualRecalculatePrimRef>::anon_class_24_3_3f686411::operator()
              (&pinfo,&computePrimInfo,(range<unsigned_long> *)&context);
  }
  else {
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_140 = (undefined1  [8])0x400;
    local_160[0] = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
    local_160[1] = (code *)&computePrimInfo;
    local_150._0_8_ = uVar4;
    local_150._8_8_ = uVar3;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>(embree::sse2::VirtualRecalculatePrimRef_const&,embree::LinearSpace3<embree::Vec3fa>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>(embree::sse2::VirtualRecalculatePrimRef_const&,embree::LinearSpace3<embree::Vec3fa>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
              (&pinfo,(d1 *)&local_150.field_1,&local_1f8,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_160,
               (anon_class_16_2_ed117de8_conflict17 *)
               PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
               (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                *)&context,in_stack_fffffffffffffdc8);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar6 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
  }
  pmVar5 = this->prims;
  BVar1 = (this->super_PrimInfoMB).time_range;
  uVar3 = (this->super_PrimInfoMB).object_range._begin;
  uVar4 = (this->super_PrimInfoMB).object_range._end;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
            (&__return_storage_ptr__->super_PrimInfoMB,&pinfo);
  __return_storage_ptr__->prims = pmVar5;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._begin = uVar3;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._end = uVar4;
  BVar2 = (__return_storage_ptr__->super_PrimInfoMB).time_range;
  fVar9 = BVar2.lower;
  fVar10 = BVar2.upper;
  local_208 = BVar1.lower;
  fStack_204 = BVar1.upper;
  uVar7 = -(uint)(fVar9 < local_208);
  uVar8 = -(uint)(fVar10 < fStack_204);
  (__return_storage_ptr__->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar8 & (uint)fStack_204,~uVar7 & (uint)fVar9) |
               CONCAT44((uint)fVar10 & uVar8,(uint)local_208 & uVar7));
  return __return_storage_ptr__;
}

Assistant:

const SetMB primInfo(const RecalculatePrimRef& recalculatePrimRef, const LinearSpace3fa& space) const
      {
        auto computePrimInfo = [&](const range<size_t>& r) -> PrimInfoMB
        {
          PrimInfoMB pinfo(empty);
          for (size_t j=r.begin(); j<r.end(); j++)
          {
            PrimRefMB& ref = (*prims)[j];
            PrimRefMB ref1 = recalculatePrimRef(ref,time_range,space);
            pinfo.add_primref(ref1);
          };
          return pinfo;
        };
        
        const PrimInfoMB pinfo = parallel_reduce(object_range.begin(), object_range.end(), PARALLEL_FIND_BLOCK_SIZE, PARALLEL_THRESHOLD, 
                                                 PrimInfoMB(empty), computePrimInfo, PrimInfoMB::merge2);

        return SetMB(pinfo,prims,object_range,time_range);
      }